

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O3

void thread3(void)

{
  bool bVar1;
  ulong uVar2;
  Sched *pSVar3;
  uint uVar4;
  char str [64];
  char **local_80;
  char *local_78 [9];
  
  local_78[0] = "[Thread 3] started";
  fiber_exec_on(&the_thread->fiber,&(the_thread->sched->main_thread).fiber,run_put_str,local_78);
  pSVar3 = the_thread->sched;
  if (pSVar3->shutdown_signal == false) {
    uVar2 = 0;
    uVar4 = 10;
    do {
      snprintf((char *)local_78,0x40,"[Thread 3] running: %d",uVar2);
      local_80 = local_78;
      fiber_exec_on(&the_thread->fiber,&(the_thread->sched->main_thread).fiber,run_put_str,&local_80
                   );
      thread_switch(the_thread,the_thread->next);
      pSVar3 = the_thread->sched;
      if (pSVar3->shutdown_signal != false) break;
      uVar2 = (ulong)((int)uVar2 + 1);
      bVar1 = 1 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar1);
  }
  local_78[0] = "[Thread 3] exiting";
  fiber_exec_on(&the_thread->fiber,&(pSVar3->main_thread).fiber,run_put_str,local_78);
  return;
}

Assistant:

static void
thread3(void)
{
    put_str("[Thread 3] started");
    int tok = 0;
    int rounds = 10;
    while (!shutting_down() && rounds-- > 0) {
        char str[64];
        snprintf(str, sizeof str, "[Thread 3] running: %d", tok++);
        put_str(str);
        yield();
    }

    put_str("[Thread 3] exiting");
}